

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

string * __thiscall
el::base::utils::OS::getBashOutput_abi_cxx11_(string *__return_storage_ptr__,OS *this,char *command)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  char hBuff [4096];
  undefined8 uStack_1020;
  char acStack_1018 [4096];
  
  if (this != (OS *)0x0) {
    uStack_1020 = 0x161b82;
    __stream = popen((char *)this,"r");
    if (__stream != (FILE *)0x0) {
      uStack_1020 = 0x161b9a;
      pcVar1 = fgets(acStack_1018,0x1000,__stream);
      uStack_1020 = 0x161ba5;
      pclose(__stream);
      if (pcVar1 != (char *)0x0) {
        uStack_1020 = 0x161bb5;
        sVar2 = strlen(acStack_1018);
        if ((sVar2 != 0) && (acStack_1018[sVar2 - 1] == '\n')) {
          acStack_1018[sVar2 - 1] = '\0';
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        uStack_1020 = 0x161bd9;
        sVar2 = strlen(acStack_1018);
        uStack_1020 = 0x161be8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,acStack_1018,acStack_1018 + sVar2);
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

const std::string OS::getBashOutput(const char* command) {
#if (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
  if (command == nullptr) {
    return std::string();
  }
  FILE* proc = nullptr;
  if ((proc = popen(command, "r")) == nullptr) {
    ELPP_INTERNAL_ERROR("\nUnable to run command [" << command << "]", true);
    return std::string();
  }
  char hBuff[4096];
  if (fgets(hBuff, sizeof(hBuff), proc) != nullptr) {
    pclose(proc);
    const std::size_t buffLen = strlen(hBuff);
    if (buffLen > 0 && hBuff[buffLen - 1] == '\n') {
      hBuff[buffLen - 1] = '\0';
    }
    return std::string(hBuff);
  } else {
    pclose(proc);
  }
  return std::string();
#else
  ELPP_UNUSED(command);
  return std::string();
#endif  // (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
}